

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_550beb::PointerToMemberType::printRight
          (PointerToMemberType *this,OutputStream *s)

{
  Node *pNVar1;
  int iVar2;
  char cVar3;
  
  pNVar1 = this->MemberType;
  if (pNVar1->ArrayCache == Unknown) {
    iVar2 = (*pNVar1->_vptr_Node[1])(pNVar1,s);
    cVar3 = (char)iVar2;
  }
  else {
    cVar3 = pNVar1->ArrayCache == Yes;
  }
  if (cVar3 == '\0') {
    pNVar1 = this->MemberType;
    if (pNVar1->FunctionCache == Unknown) {
      iVar2 = (*pNVar1->_vptr_Node[2])(pNVar1,s);
      cVar3 = (char)iVar2;
    }
    else {
      cVar3 = pNVar1->FunctionCache == Yes;
    }
    if (cVar3 == '\0') goto LAB_001c12ba;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = ')';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_001c12ba:
  (*this->MemberType->_vptr_Node[5])(this->MemberType,s);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += ")";
    MemberType->printRight(s);
  }